

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_line.cc
# Opt level: O0

pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
* StringLine::convert_string
            (pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
             *__return_storage_ptr__,string *s)

{
  bool bVar1;
  byte bVar2;
  reference pcVar3;
  element_type *peVar4;
  string *psVar5;
  int local_100 [2];
  string local_f8 [32];
  shared_ptr<StringLine> local_d8;
  string local_c8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  byte local_9a;
  byte local_99;
  undefined4 local_98;
  bool annotationInString;
  bool isAnnotation;
  int state;
  string local_88 [32];
  undefined1 local_68 [8];
  shared_ptr<StringLine> sl;
  const_iterator it;
  undefined1 local_48 [4];
  int lineNumber;
  vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> errors;
  vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> sls;
  string *s_local;
  
  std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::vector
            ((vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> *)
             &errors.super__Vector_base<ErrorInfoException,_std::allocator<ErrorInfoException>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>::vector
            ((vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *)local_48);
  it._M_current._4_4_ = 1;
  sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::__cxx11::string::begin();
  std::__cxx11::string::string(local_88);
  std::make_shared<StringLine,int&,std::__cxx11::string>
            ((int *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&it._M_current + 4));
  std::__cxx11::string::~string(local_88);
  local_98 = 0;
  local_99 = 0;
  local_9a = 0;
  while( true ) {
    local_a8._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ,&local_a8);
    if (!bVar1) break;
    switch(local_98) {
    case 0:
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
      if ((*pcVar3 == '/') && ((local_9a & 1) == 0)) {
        local_98 = 1;
      }
      else {
        local_98 = 6;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator--((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      break;
    case 1:
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
      if (*pcVar3 == '/') {
        local_98 = 2;
      }
      else {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
        if (*pcVar3 == '*') {
          local_98 = 4;
        }
        else {
          local_98 = 0;
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator--((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      );
        }
      }
      break;
    case 2:
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
      if (*pcVar3 == '\n') {
        local_98 = 3;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator--((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        peVar4 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_68);
        psVar5 = get_text_abi_cxx11_(peVar4);
        std::__cxx11::string::push_back((char)psVar5);
        local_98 = 2;
      }
      break;
    case 3:
      peVar4 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
      psVar5 = get_text_abi_cxx11_(peVar4);
      sutil::trim(&local_c8,psVar5);
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_c8);
      if (((bVar2 ^ 0xff) & 1) != 0) {
        peVar4 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_68);
        psVar5 = get_text_abi_cxx11_(peVar4);
        std::__cxx11::string::push_back((char)psVar5);
        std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::
        push_back((vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
                   *)&errors.
                      super__Vector_base<ErrorInfoException,_std::allocator<ErrorInfoException>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_68);
      }
      std::__cxx11::string::string(local_f8);
      std::make_shared<StringLine,int&,std::__cxx11::string>
                ((int *)&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&it._M_current + 4));
      std::shared_ptr<StringLine>::operator=((shared_ptr<StringLine> *)local_68,&local_d8);
      std::shared_ptr<StringLine>::~shared_ptr(&local_d8);
      std::__cxx11::string::~string(local_f8);
      it._M_current._4_4_ = it._M_current._4_4_ + 1;
      local_98 = 0;
      if ((local_99 & 1) != 0) {
        local_98 = 4;
      }
      break;
    case 4:
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
      if (*pcVar3 == '*') {
        local_98 = 5;
      }
      else {
        local_99 = 1;
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
        if (*pcVar3 == '\n') {
          local_98 = 3;
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator--((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      );
        }
        else {
          peVar4 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_68);
          psVar5 = get_text_abi_cxx11_(peVar4);
          std::__cxx11::string::push_back((char)psVar5);
          local_98 = 4;
        }
      }
      break;
    case 5:
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
      if (*pcVar3 == '/') {
        peVar4 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_68);
        psVar5 = get_text_abi_cxx11_(peVar4);
        std::__cxx11::string::append((char *)psVar5);
        local_99 = 0;
        local_98 = 0;
      }
      else {
        local_98 = 4;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator--((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      break;
    case 6:
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
      if (*pcVar3 == '\"') {
        local_9a = (local_9a ^ 0xff) & 1;
      }
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
      if ((*pcVar3 == '/') && ((local_9a & 1) == 0)) {
        local_98 = 0;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator--((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
        if (*pcVar3 == '\n') {
          local_98 = 3;
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator--((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      );
        }
        else {
          peVar4 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_68);
          set_line(peVar4,it._M_current._4_4_);
          peVar4 = std::__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<StringLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_68);
          psVar5 = get_text_abi_cxx11_(peVar4);
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
          ;
          std::__cxx11::string::push_back((char)psVar5);
          local_98 = 6;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&sl.super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  if ((local_99 & 1) != 0) {
    local_100[1] = 0;
    local_100[0] = 0;
    std::vector<ErrorInfoException,std::allocator<ErrorInfoException>>::
    emplace_back<int&,int,int,char_const(&)[40]>
              ((vector<ErrorInfoException,std::allocator<ErrorInfoException>> *)local_48,
               (int *)((long)&it._M_current + 4),local_100 + 1,local_100,
               (char (*) [40])"Brother, where is your annotation tail?");
  }
  std::
  make_pair<std::vector<std::shared_ptr<StringLine>,std::allocator<std::shared_ptr<StringLine>>>&,std::vector<ErrorInfoException,std::allocator<ErrorInfoException>>&>
            (__return_storage_ptr__,
             (vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> *)
             &errors.super__Vector_base<ErrorInfoException,_std::allocator<ErrorInfoException>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *)local_48);
  std::shared_ptr<StringLine>::~shared_ptr((shared_ptr<StringLine> *)local_68);
  std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>::~vector
            ((vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *)local_48);
  std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::~vector
            ((vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> *)
             &errors.super__Vector_base<ErrorInfoException,_std::allocator<ErrorInfoException>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<std::shared_ptr<StringLine>>, std::vector<ErrorInfoException>>
StringLine::convert_string(const std::string *s) {
    std::vector<std::shared_ptr<StringLine>> sls;
    std::vector<ErrorInfoException> errors;
    int lineNumber = 1;
    auto it = s->begin();
    //StringLine
    auto sl = std::make_shared<StringLine>(lineNumber, std::string());
    int state = 0;
    //判断当前扫描的字符串是否在注释中
    bool isAnnotation = false;
    //判断注释是否在字符串中
    bool annotationInString = false;
    while (it != s->end()) {
        switch (state) {
            //初始读取状态，判断是注释还是普通字符
            case 0: {
                //注释如果在字符里面，就不进行跳转，当作普通字符处理
                if (*it == '/' && !annotationInString)state = 1;
                else {
                    state = 6;
                    --it;
                }
                break;
            }
                //判断第二个/，或者第一个*
            case 1: {
                if (*it == '/')state = 2;
                else if (*it == '*')state = 4;
                else {
                    state = 0;
                    --it;
                }
                break;
            }
                // 判断是//注释，还是换行停止
            case 2: {
                if (*it == '\n') {
                    state = 3;
                    --it;
                } else {
                    sl->get_text().push_back(' ');
                    state = 2;
                }
                break;
            }
                //处理已经读取了一行的情况
            case 3: {
                if (!sutil::trim(sl->get_text()).empty()) {
                    sl->get_text().push_back('\n');
                    sls.push_back(sl);
                }
                sl = std::make_shared<StringLine>(lineNumber, std::string());
                ++lineNumber;
                state = isAnnotation ? 4 : 0;
                break;
            }
                // 处理/*注释
            case 4: {
                if (*it == '*')state = 5;
                else {
                    isAnnotation = true;
                    if (*it == '\n') {
                        state = 3;
                        --it;
                    } else {
                        sl->get_text().push_back(' ');
                        state = 4;
                    }
                }
                break;
            }
                // 判断*后面是否是/
            case 5: {
                if (*it == '/') {
                    sl->get_text().append("    ");
                    isAnnotation = false;
                    state = 0;
                } else {
                    state = 4;
                    --it;
                }
                break;
            }
                //读取普通字符
            case 6: {
                if (*it == '"') annotationInString = !annotationInString;
                if (*it == '/' && !annotationInString) {
                    state = 0;
                    --it;
                } else if (*it != '\n') {
                    sl->set_line(lineNumber);
                    sl->get_text().push_back(*it);
                    state = 6;
                } else {
                    state = 3;
                    --it;
                }
            }
            default: {
            }
        }
        ++it;
    }
    if (isAnnotation) {
        errors.emplace_back(lineNumber, 0, 0,  "Brother, where is your annotation tail?");
    }
    return std::make_pair(sls, errors);
}